

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O0

size_t __thiscall ODDLParser::Value::size(Value *this)

{
  Value *local_20;
  Value *n;
  size_t result;
  Value *this_local;
  
  n = (Value *)0x1;
  for (local_20 = this->m_next; local_20 != (Value *)0x0; local_20 = local_20->m_next) {
    n = (Value *)((long)&n->m_type + 1);
  }
  return (size_t)n;
}

Assistant:

size_t Value::size() const{
    size_t result=1;
    Value *n=m_next;
    while( n!=ddl_nullptr) {
        result++;
        n=n->m_next;
    }
    return result;
}